

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

uint64_t __thiscall
duckdb::TimestampRangeInfo::ListLength
          (TimestampRangeInfo *this,timestamp_t start_value,timestamp_t end_value,
          interval_t increment_value,bool inclusive_bound)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  InvalidInputException *pIVar4;
  long lVar5;
  uint64_t uVar6;
  bool bVar7;
  bool bVar8;
  interval_t iVar9;
  interval_t iVar10;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar5 = increment_value._0_8_;
  bVar1 = 0 < (int)end_value.value;
  bVar2 = 0 < (int)((ulong)end_value.value >> 0x20);
  bVar8 = lVar5 < 0;
  bVar3 = 0 < lVar5;
  bVar7 = (end_value.value & 0x8000000080000000U) != 0;
  if ((bVar7 || bVar8) || ((bVar3 || bVar1) || bVar2)) {
    if ((((this == (TimestampRangeInfo *)0x8000000000000001) ||
         (this == (TimestampRangeInfo *)0x7fffffffffffffff)) ||
        (start_value.value == 0x7fffffffffffffff)) || (start_value.value == -0x7fffffffffffffff)) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Interval infinite bounds not supported","");
      duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bVar7 || bVar8) && ((bVar3 || bVar1) || bVar2)) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Interval with mix of negative/positive entries not supported",
                 "");
      duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = 0;
    if ((start_value.value <= (long)this || !bVar7 && !bVar8) &&
       ((long)this <= start_value.value || (!bVar3 && !bVar1) && !bVar2)) {
      uVar6 = 0;
      if (bVar7 || bVar8) {
        while( true ) {
          bVar1 = start_value.value < (long)this;
          if ((char)increment_value.micros != '\0') {
            bVar1 = start_value.value <= (long)this;
          }
          if (!bVar1) break;
          iVar9.micros = lVar5;
          iVar9._0_8_ = end_value.value;
          this = (TimestampRangeInfo *)duckdb::Interval::Add((timestamp_t)this,iVar9);
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x100000000) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"Lists larger than 2^32 elements are not supported","");
            duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)local_50);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        while( true ) {
          bVar1 = (long)this < start_value.value;
          if ((char)increment_value.micros != '\0') {
            bVar1 = (long)this <= start_value.value;
          }
          if (!bVar1) break;
          iVar10.micros = lVar5;
          iVar10._0_8_ = end_value.value;
          this = (TimestampRangeInfo *)duckdb::Interval::Add((timestamp_t)this,iVar10);
          uVar6 = uVar6 + 1;
          if (uVar6 == 0x100000000) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,"Lists larger than 2^32 elements are not supported","");
            duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)local_50);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
  }
  else {
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

static uint64_t ListLength(timestamp_t start_value, timestamp_t end_value, interval_t increment_value,
	                           bool inclusive_bound) {
		bool is_positive = increment_value.months > 0 || increment_value.days > 0 || increment_value.micros > 0;
		bool is_negative = increment_value.months < 0 || increment_value.days < 0 || increment_value.micros < 0;
		if (!is_negative && !is_positive) {
			// interval is 0: no result
			return 0;
		}
		// We don't allow infinite bounds because they generate errors or infinite loops
		if (!Timestamp::IsFinite(start_value) || !Timestamp::IsFinite(end_value)) {
			throw InvalidInputException("Interval infinite bounds not supported");
		}

		if (is_negative && is_positive) {
			// we don't allow a mix of
			throw InvalidInputException("Interval with mix of negative/positive entries not supported");
		}
		if (start_value > end_value && is_positive) {
			return 0;
		}
		if (start_value < end_value && is_negative) {
			return 0;
		}
		uint64_t total_values = 0;
		if (is_negative) {
			// negative interval, start_value is going down
			while (inclusive_bound ? start_value >= end_value : start_value > end_value) {
				start_value = Interval::Add(start_value, increment_value);
				total_values++;
				if (total_values > NumericLimits<uint32_t>::Maximum()) {
					throw InvalidInputException("Lists larger than 2^32 elements are not supported");
				}
			}
		} else {
			// positive interval, start_value is going up
			while (inclusive_bound ? start_value <= end_value : start_value < end_value) {
				start_value = Interval::Add(start_value, increment_value);
				total_values++;
				if (total_values > NumericLimits<uint32_t>::Maximum()) {
					throw InvalidInputException("Lists larger than 2^32 elements are not supported");
				}
			}
		}
		return total_values;
	}